

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::File> * __thiscall asl::Array<asl::File>::insert(Array<asl::File> *this,int k,File *x)

{
  uint uVar1;
  int iVar2;
  Endian EVar3;
  uint *puVar4;
  File *pFVar5;
  undefined8 *puVar6;
  uint uVar7;
  int iVar8;
  
  pFVar5 = this->_a;
  uVar1 = pFVar5[-1]._info.flags;
  iVar2 = *(int *)&pFVar5[-1]._info.field_0x1c;
  uVar7 = k;
  if (k < 0) {
    uVar7 = uVar1;
  }
  if ((int)uVar1 < iVar2) {
    puVar4 = &pFVar5[-1]._info.flags;
LAB_001382f3:
    if (uVar1 - uVar7 != 0 && (int)uVar7 <= (int)uVar1) {
      memmove(pFVar5 + (long)(int)uVar7 + 1,pFVar5 + (int)uVar7,(long)(int)(uVar1 - uVar7) * 0x48);
      pFVar5 = this->_a;
    }
    File::File(pFVar5 + (int)uVar7,x);
    *puVar4 = uVar1 + 1;
    return this;
  }
  if (uVar1 != 0x7fffffff) {
    dup(this,k);
    EVar3 = this->_a[-1]._endian;
    iVar8 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar8 = iVar2 * 2 + 2;
    }
    puVar4 = (uint *)realloc(&this->_a[-1]._info.flags,(long)iVar8 * 0x48 + 0x10);
    if (puVar4 != (uint *)0x0) {
      pFVar5 = (File *)(puVar4 + 4);
      this->_a = pFVar5;
      puVar4[1] = iVar8;
      puVar4[2] = EVar3;
      goto LAB_001382f3;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = dup2;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}